

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brdf_plot.cpp
# Opt level: O2

void __thiscall brdf_plot::brdf_plot(brdf_plot *this)

{
  vec<3,_float,_(glm::precision)0> vVar1;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_18;
  
  this->_size = 0x200;
  (this->_sphere_origin).field_0.field_0.z = 0.0;
  *(undefined8 *)&(this->_eye_position).field_0 = 0;
  *(undefined8 *)((long)&(this->_eye_position).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->_eye_target).field_0 + 4) = 0;
  *(undefined8 *)&(this->_sphere_origin).field_0 = 0;
  local_18._0_8_ = 0x3f800000bf800000;
  local_18.field_0.z = 0.0;
  vVar1 = glm::detail::compute_normalize<3,_float,_(glm::precision)0,_glm::vec,_false>::call
                    ((vec<3,_float,_(glm::precision)0> *)&local_18.field_0);
  *(long *)&(this->_view_dir).field_0 = vVar1.field_0._0_8_;
  (this->_view_dir).field_0.field_0.z = vVar1.field_0._8_4_;
  (this->_view_matrix_inv).value[0].field_0.field_0.x = 1.0;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[0].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[0].field_0 + 0xc) = 0;
  (this->_view_matrix_inv).value[1].field_0.field_0.y = 1.0;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[1].field_0 + 8) = 0;
  *(undefined8 *)&(this->_view_matrix_inv).value[2].field_0 = 0;
  (this->_view_matrix_inv).value[2].field_0.field_0.z = 1.0;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[2].field_0 + 0xc) = 0;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[3].field_0 + 4) = 0;
  (this->_view_matrix_inv).value[3].field_0.field_0.w = 1.0;
  return;
}

Assistant:

brdf_plot::brdf_plot():
  _size{512},
  _view_dir{glm::normalize(glm::vec3{-1.0f, 1.0f, 0.0f})}
{
}